

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerSpreadCall(Lowerer *this,Instr *instr,CallFlags callFlags,bool setupProfiledVersion)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  byte bVar4;
  int32 iVar5;
  RegOpnd *functionObjOpnd;
  undefined4 *puVar6;
  LabelInstr *continueAfterExLabel;
  Instr *pIVar7;
  Opnd *opndArg;
  Opnd *newSrc;
  IntConstOpnd *pIVar8;
  RegOpnd *opndArg_00;
  HelperCallOpnd *this_01;
  ushort uVar9;
  JitProfilingInstr *jitInstr;
  ushort callFlags_00;
  JnHelperMethod fnHelper;
  
  callFlags_00 = (ushort)callFlags;
  functionObjOpnd = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar2 = IR::Opnd::GetKind((Opnd *)functionObjOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005abffe;
    *puVar6 = 0;
  }
  functionObjOpnd->field_0x18 = functionObjOpnd->field_0x18 | 2;
  if ((((byte)callFlags | setupProfiledVersion) & 1) == 0) {
    continueAfterExLabel = InsertContinueAfterExceptionLabelForDebugger(this->m_func,instr,false);
    LowererMDArch::GenerateFunctionObjectTest
              (&(this->m_lowererMD).lowererMDArch,instr,functionObjOpnd,false,continueAfterExLabel);
  }
  pIVar7 = GetLdSpreadIndicesInstr(instr);
  if (pIVar7->m_opcode != LdSpreadIndices) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69a1,"(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices)",
                       "spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices");
    if (!bVar3) goto LAB_005abffe;
    *puVar6 = 0;
  }
  opndArg = IR::Instr::UnlinkSrc1(pIVar7);
  newSrc = IR::Instr::UnlinkSrc2(pIVar7);
  IR::Instr::ReplaceSrc2(instr,newSrc);
  if ((callFlags & CallFlags_New) == CallFlags_None) {
    uVar9 = 2;
    if (instr->m_dst == (Opnd *)0x0) {
      uVar9 = 0x10;
    }
    callFlags_00 = callFlags_00 | uVar9;
  }
  this_00 = &this->m_lowererMD;
  iVar5 = LowererMDArch::LowerCallArgs
                    (&(this->m_lowererMD).lowererMDArch,instr,callFlags_00,
                     (ushort)setupProfiledVersion + (ushort)setupProfiledVersion * 2 + 2,
                     (IntConstOpnd **)0x0);
  fnHelper = HelperSpreadCall;
  if (setupProfiledVersion) {
    pIVar8 = IR::Opnd::CreateProfileIdOpnd
                       (*(ProfileId *)((long)&instr[1]._vptr_Instr + 2),this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar8->super_Opnd);
    pIVar8 = IR::Opnd::CreateProfileIdOpnd(*(ProfileId *)&instr[1]._vptr_Instr,this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar8->super_Opnd);
    opndArg_00 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&opndArg_00->super_Opnd);
    fnHelper = HelperProfiledNewScObjArraySpread;
  }
  LowererMD::LoadHelperArgument(this_00,instr,(Opnd *)functionObjOpnd);
  LowererMD::LoadHelperArgument(this_00,instr,opndArg);
  this_01 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005abffe;
    *puVar6 = 0;
  }
  func = instr->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005abffe:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_01->super_Opnd;
  pIVar7 = LowererMD::LowerCall(this_00,instr,(ArgSlot)iVar5);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerSpreadCall(IR::Instr *instr, Js::CallFlags callFlags, bool setupProfiledVersion)
{
    // Get the target function object, and emit function object test.
    IR::RegOpnd * functionObjOpnd = instr->UnlinkSrc1()->AsRegOpnd();
    functionObjOpnd->m_isCallArg = true;

    if (!(callFlags & Js::CallFlags_New) && !setupProfiledVersion)
    {
        IR::LabelInstr* continueAfterExLabel = InsertContinueAfterExceptionLabelForDebugger(m_func, instr, false);
        this->m_lowererMD.GenerateFunctionObjectTest(instr, functionObjOpnd, false, continueAfterExLabel);
    }

    IR::Instr *spreadIndicesInstr;

    spreadIndicesInstr = GetLdSpreadIndicesInstr(instr);
    Assert(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices);

    // Get AuxArray
    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->UnlinkSrc1();
    // Remove LdSpreadIndices from the argument chain
    instr->ReplaceSrc2(spreadIndicesInstr->UnlinkSrc2());

    // Emit the normal args
    if (!(callFlags & Js::CallFlags_New))
    {
        callFlags = (Js::CallFlags)(callFlags | (instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed));
    }

    // Profiled helper call requires three more parameters, ArrayProfileId, profileId, and the frame pointer.
    // This is just following the convention of HelperProfiledNewScObjArray call.
    const unsigned short extraArgsCount = setupProfiledVersion ? 5 : 2; // function object and AuxArray
    int32 argCount = this->m_lowererMD.LowerCallArgs(instr, (ushort)callFlags, extraArgsCount);

    // Emit our extra (first) args for the Spread helper in reverse order
    if (setupProfiledVersion)
    {
        IR::JitProfilingInstr* jitInstr = (IR::JitProfilingInstr*)instr;
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->arrayProfileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->profileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateFramePointerOpnd(m_func));
    }

    m_lowererMD.LoadHelperArgument(instr, functionObjOpnd);
    m_lowererMD.LoadHelperArgument(instr, spreadIndicesOpnd);

    // Change the call target to our helper
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(setupProfiledVersion ? IR::HelperProfiledNewScObjArraySpread : IR::HelperSpreadCall, this->m_func);
    instr->SetSrc1(helperOpnd);

    return this->m_lowererMD.LowerCall(instr, (Js::ArgSlot)argCount);
}